

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::DBImpl(DBImpl *this,Options *raw_options,string *dbname)

{
  int entries;
  TableCache *this_00;
  WriteBatch *this_01;
  VersionSet *this_02;
  CompactionStats *local_28;
  string *dbname_local;
  Options *raw_options_local;
  DBImpl *this_local;
  
  DB::DB(&this->super_DB);
  (this->super_DB)._vptr_DB = (_func_int **)&PTR__DBImpl_001601c8;
  this->env_ = raw_options->env;
  InternalKeyComparator::InternalKeyComparator(&this->internal_comparator_,raw_options->comparator);
  InternalFilterPolicy::InternalFilterPolicy
            (&this->internal_filter_policy_,raw_options->filter_policy);
  SanitizeOptions(&this->options_,dbname,&this->internal_comparator_,&this->internal_filter_policy_,
                  raw_options);
  this->owns_info_log_ = (this->options_).info_log != raw_options->info_log;
  this->owns_cache_ = (this->options_).block_cache != raw_options->block_cache;
  std::__cxx11::string::string((string *)&this->dbname_,(string *)dbname);
  this_00 = (TableCache *)operator_new(0x38);
  entries = TableCacheSize(&this->options_);
  TableCache::TableCache(this_00,&this->dbname_,&this->options_,entries);
  this->table_cache_ = this_00;
  this->db_lock_ = (FileLock *)0x0;
  port::Mutex::Mutex(&this->mutex_);
  std::atomic<bool>::atomic(&this->shutting_down_,false);
  port::CondVar::CondVar(&this->background_work_finished_signal_,&this->mutex_);
  this->mem_ = (MemTable *)0x0;
  this->imm_ = (MemTable *)0x0;
  std::atomic<bool>::atomic(&this->has_imm_,false);
  this->logfile_ = (WritableFile *)0x0;
  this->logfile_number_ = 0;
  this->log_ = (Writer *)0x0;
  this->seed_ = 0;
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::deque
            (&this->writers_);
  this_01 = (WriteBatch *)operator_new(0x20);
  WriteBatch::WriteBatch(this_01);
  this->tmp_batch_ = this_01;
  SnapshotList::SnapshotList(&this->snapshots_);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            (&this->pending_outputs_);
  this->background_compaction_scheduled_ = false;
  this->manual_compaction_ = (ManualCompaction *)0x0;
  this_02 = (VersionSet *)operator_new(0x250);
  VersionSet::VersionSet
            (this_02,&this->dbname_,&this->options_,this->table_cache_,&this->internal_comparator_);
  this->versions_ = this_02;
  Status::Status(&this->bg_error_);
  local_28 = this->stats_;
  do {
    CompactionStats::CompactionStats(local_28);
    local_28 = local_28 + 1;
  } while ((DBImpl *)local_28 != this + 1);
  return;
}

Assistant:

DBImpl::DBImpl(const Options& raw_options, const std::string& dbname)
    : env_(raw_options.env),
      internal_comparator_(raw_options.comparator),
      internal_filter_policy_(raw_options.filter_policy),
      options_(SanitizeOptions(dbname, &internal_comparator_,
                               &internal_filter_policy_, raw_options)),
      owns_info_log_(options_.info_log != raw_options.info_log),
      owns_cache_(options_.block_cache != raw_options.block_cache),
      dbname_(dbname),
      table_cache_(new TableCache(dbname_, options_, TableCacheSize(options_))),
      db_lock_(nullptr),
      shutting_down_(false),
      background_work_finished_signal_(&mutex_),
      mem_(nullptr),
      imm_(nullptr),
      has_imm_(false),
      logfile_(nullptr),
      logfile_number_(0),
      log_(nullptr),
      seed_(0),
      tmp_batch_(new WriteBatch),
      background_compaction_scheduled_(false),
      manual_compaction_(nullptr),
      versions_(new VersionSet(dbname_, &options_, table_cache_,
                               &internal_comparator_)) {}